

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O0

Benchmark * __thiscall benchmark::internal::Benchmark::Arg(Benchmark *this,int x)

{
  int iVar1;
  Benchmark *in_RDI;
  int in_stack_0000002c;
  BenchmarkImp *in_stack_00000030;
  BenchmarkImp *in_stack_ffffffffffffffc0;
  CheckHandler *this_00;
  char *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  byte bVar2;
  CheckHandler local_18 [3];
  
  iVar1 = BenchmarkImp::ArgsCnt(in_stack_ffffffffffffffc0);
  bVar2 = 0;
  if (iVar1 != -1) {
    iVar1 = BenchmarkImp::ArgsCnt(in_stack_ffffffffffffffc0);
    if (iVar1 != 1) {
      this_00 = local_18;
      CheckHandler::CheckHandler
                ((CheckHandler *)CONCAT17(bVar2,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8
                 ,in_stack_ffffffffffffffd0,(char *)in_RDI,(int)((ulong)this_00 >> 0x20));
      bVar2 = 1;
      CheckHandler::GetLog(this_00);
      goto LAB_00166e21;
    }
  }
  GetNullLogInstance();
LAB_00166e21:
  if ((bVar2 & 1) == 0) {
    BenchmarkImp::Arg(in_stack_00000030,in_stack_0000002c);
    return in_RDI;
  }
  CheckHandler::~CheckHandler((CheckHandler *)&LAB_00166e34);
}

Assistant:

Benchmark* Benchmark::Arg(int x) {
  CHECK(imp_->ArgsCnt() == -1 || imp_->ArgsCnt() == 1);
  imp_->Arg(x);
  return this;
}